

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const*,unsigned_int&,char_const(&)[3],unsigned_int&>
          (String *__return_storage_ptr__,kj *this,char **params,uint *params_1,char (*params_2) [3]
          ,uint *params_3)

{
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  CappedArray<char,_14UL> local_60;
  CappedArray<char,_14UL> local_48;
  
  local_70 = toCharSequence<char_const*>((char **)this);
  toCharSequence<unsigned_int&>(&local_48,(kj *)params,(uint *)local_70.size_);
  local_80 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  toCharSequence<unsigned_int&>(&local_60,(kj *)params_2,(uint *)local_80.size_);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_70,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)&local_80,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_14UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}